

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_adf.cc
# Opt level: O2

base_learner * cb_adf_setup(options_i *options,vw *all)

{
  _Head_base<0UL,_CB_ADF::cb_adf_*,_false> _Var1;
  int iVar2;
  int iVar3;
  int iVar4;
  option_group_definition *poVar5;
  ostream *poVar6;
  base_learner *l;
  multi_learner *base;
  learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  byte bVar11;
  size_t ws;
  byte bVar12;
  size_t sStack_450;
  bool cb_adf_option;
  allocator local_440;
  allocator local_43f;
  allocator local_43e;
  allocator local_43d;
  allocator local_43c;
  allocator local_43b;
  allocator local_43a;
  allocator local_439;
  free_ptr<CB_ADF::cb_adf> ld;
  string type_string;
  undefined1 local_408 [112];
  bool local_398;
  string local_368 [32];
  string local_348 [32];
  undefined1 local_328 [160];
  string local_288 [32];
  string local_268;
  string local_248 [32];
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  option_group_definition new_options;
  undefined1 local_170 [112];
  bool local_100;
  undefined1 local_d0 [112];
  bool local_60;
  
  bVar12 = 0;
  scoped_calloc_or_throw<CB_ADF::cb_adf>();
  cb_adf_option = false;
  std::__cxx11::string::string((string *)&type_string,"mtr",(allocator *)local_408);
  std::__cxx11::string::string
            ((string *)&local_1c8,"Contextual Bandit with Action Dependent Features",
             (allocator *)local_408);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::string((string *)&local_1e8,"cb_adf",&local_439);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_408,&local_1e8,&cb_adf_option);
  local_398 = true;
  std::__cxx11::string::string
            (local_348,"Do Contextual Bandit learning with multiline action dependent features.",
             &local_43a);
  std::__cxx11::string::_M_assign((string *)(local_408 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (&new_options,(typed_option<bool> *)local_408);
  std::__cxx11::string::string((string *)&local_208,"rank_all",&local_43b);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_170,&local_208,
             &(ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all);
  local_100 = true;
  std::__cxx11::string::string(local_368,"Return actions sorted by score order",&local_43c);
  std::__cxx11::string::_M_assign((string *)(local_170 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_170);
  std::__cxx11::string::string((string *)&local_228,"no_predict",&local_43d);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_328,&local_228,
             &(ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
               super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
               super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->no_predict);
  std::__cxx11::string::string(local_248,"Do not do a prediction when training",&local_43e);
  std::__cxx11::string::_M_assign((string *)(local_328 + 0x30));
  poVar5 = VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
                     (poVar5,(typed_option<bool> *)local_328);
  std::__cxx11::string::string((string *)&local_268,"cb_type",&local_43f);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_d0,&local_268,&type_string);
  local_60 = true;
  std::__cxx11::string::string
            (local_288,"contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr",
             &local_440);
  std::__cxx11::string::_M_assign((string *)(local_d0 + 0x30));
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar5,(typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)local_d0);
  std::__cxx11::string::~string(local_288);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_d0);
  std::__cxx11::string::~string((string *)&local_268);
  std::__cxx11::string::~string(local_248);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_328);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string(local_368);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_170);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string(local_348);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_408);
  std::__cxx11::string::~string((string *)&local_1e8);
  (**options->_vptr_options_i)(options,&new_options);
  if (cb_adf_option == false) {
    plVar7 = (learner<CB_ADF::cb_adf,_std::vector<example_*,_std::allocator<example_*>_>_> *)0x0;
    goto LAB_0021771a;
  }
  std::__cxx11::string::string((string *)local_408,"cb_type",(allocator *)local_170);
  iVar2 = (*options->_vptr_options_i[1])(options,local_408);
  std::__cxx11::string::~string((string *)local_408);
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string((string *)local_408,"cb_type",(allocator *)local_170);
    (*options->_vptr_options_i[5])(options,local_408,&type_string);
    std::__cxx11::string::~string((string *)local_408);
    (**options->_vptr_options_i)(options,&new_options);
  }
  (ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
   super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
   super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->all = all;
  iVar2 = std::__cxx11::string::compare((char *)&type_string);
  if (iVar2 == 0) {
    ws = 2;
    sStack_450 = 0;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)&type_string);
    ws = 1;
    if (iVar3 == 0) {
      sStack_450 = 2;
LAB_00217377:
      ws = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)&type_string);
      sStack_450 = 3;
      if (iVar3 != 0) {
        iVar3 = std::__cxx11::string::compare((char *)&type_string);
        ws = 1;
        sStack_450 = ws;
        if (iVar3 != 0) {
          iVar3 = std::__cxx11::string::compare((char *)&type_string);
          if (iVar3 == 0) {
            sStack_450 = 4;
            goto LAB_00217377;
          }
          poVar6 = std::operator<<(&(all->trace_message).super_ostream,
                                   "warning: cb_type must be in {\'ips\',\'dr\',\'mtr\',\'dm\',\'sm\'}; resetting to mtr."
                                  );
          std::endl<char,std::char_traits<char>>(poVar6);
          sStack_450 = 3;
        }
      }
    }
  }
  ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
    super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
    super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->gen_cs).cb_type = sStack_450;
  all->delete_prediction = ACTION_SCORE::delete_action_scores;
  std::__cxx11::string::string((string *)local_408,"csoaa_ldf",(allocator *)local_d0);
  iVar3 = (*options->_vptr_options_i[1])(options,local_408);
  if ((char)iVar3 == '\0') {
    std::__cxx11::string::string((string *)local_170,"wap_ldf",(allocator *)local_348);
    iVar4 = (*options->_vptr_options_i[1])(options,local_170);
    bVar11 = 1;
    if (((char)iVar4 != '\0') &&
       ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all == false))
    goto LAB_00217422;
LAB_00217468:
    std::__cxx11::string::~string((string *)local_170);
LAB_00217475:
    std::__cxx11::string::~string((string *)local_408);
    if (bVar11 != 0) goto LAB_00217488;
  }
  else {
    if ((ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
         super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl)->rank_all == false) {
LAB_00217422:
      std::__cxx11::string::string((string *)local_328,"csoaa_rank",(allocator *)local_368);
      iVar4 = (*options->_vptr_options_i[1])(options,local_328);
      bVar11 = (byte)iVar4 ^ 1;
      std::__cxx11::string::~string((string *)local_328);
      if ((char)iVar3 == '\0') goto LAB_00217468;
      goto LAB_00217475;
    }
    std::__cxx11::string::~string((string *)local_408);
LAB_00217488:
    std::__cxx11::string::string((string *)local_408,"csoaa_ldf",(allocator *)local_328);
    iVar3 = (*options->_vptr_options_i[1])(options,local_408);
    std::__cxx11::string::~string((string *)local_408);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)local_408,"csoaa_ldf",(allocator *)local_d0);
      std::__cxx11::string::string((string *)local_328,"multiline",(allocator *)local_368);
      (*options->_vptr_options_i[5])(options,local_408,local_328);
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string((string *)local_408);
    }
    std::__cxx11::string::string((string *)local_408,"csoaa_rank",(allocator *)local_328);
    iVar3 = (*options->_vptr_options_i[1])(options,local_408);
    std::__cxx11::string::~string((string *)local_408);
    if ((char)iVar3 == '\0') {
      std::__cxx11::string::string((string *)local_408,"csoaa_rank",(allocator *)local_d0);
      std::__cxx11::string::string((string *)local_328,"",(allocator *)local_368);
      (*options->_vptr_options_i[5])(options,local_408,local_328);
      std::__cxx11::string::~string((string *)local_328);
      std::__cxx11::string::~string((string *)local_408);
    }
  }
  std::__cxx11::string::string((string *)local_408,"baseline",(allocator *)local_328);
  iVar3 = (*options->_vptr_options_i[1])(options,local_408);
  std::__cxx11::string::~string((string *)local_408);
  if ((char)iVar3 == '\x01' && iVar2 == 0) {
    std::__cxx11::string::string((string *)local_408,"check_enabled",(allocator *)local_d0);
    std::__cxx11::string::string((string *)local_328,"",(allocator *)local_368);
    (*options->_vptr_options_i[5])(options,local_408,local_328);
    std::__cxx11::string::~string((string *)local_328);
    std::__cxx11::string::~string((string *)local_408);
  }
  l = setup_base(options,all);
  base = LEARNER::as_multiline<char,char>(l);
  _Var1 = ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
          super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
          super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>;
  ppuVar9 = &CB::cb_label;
  plVar10 = &all->p->lp;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
    ppuVar9 = ppuVar9 + (ulong)bVar12 * -2 + 1;
    plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar12 * -0x10 + 8);
  }
  all->label_type = cb;
  plVar7 = LEARNER::learner<CB_ADF::cb_adf,std::vector<example*,std::allocator<example*>>>::
           init_learner<LEARNER::learner<char,std::vector<example*,std::allocator<example*>>>>
                     (ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
                      super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
                      super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl,base,
                      CB_ADF::do_actual_learning<true>,CB_ADF::do_actual_learning<false>,ws,
                      action_scores);
  ld._M_t.super___uniq_ptr_impl<CB_ADF::cb_adf,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_CB_ADF::cb_adf_*,_void_(*)(void_*)>.
  super__Head_base<0UL,_CB_ADF::cb_adf_*,_false>._M_head_impl = (cb_adf *)0x0;
  *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
  *(code **)(plVar7 + 0x68) = CB_ADF::finish_multiline_example;
  ((_Var1._M_head_impl)->gen_cs).scorer = all->scorer;
  *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
  *(code **)(plVar7 + 200) = CB_ADF::finish;
  *(code **)(plVar7 + 0x80) = CB_ADF::save_load;
  *(undefined8 *)(plVar7 + 0x70) = *(undefined8 *)(plVar7 + 0x18);
  *(undefined8 *)(plVar7 + 0x78) = *(undefined8 *)(plVar7 + 0x20);
LAB_0021771a:
  VW::config::option_group_definition::~option_group_definition(&new_options);
  std::__cxx11::string::~string((string *)&type_string);
  std::unique_ptr<CB_ADF::cb_adf,_void_(*)(void_*)>::~unique_ptr(&ld);
  return (base_learner *)plVar7;
}

Assistant:

base_learner* cb_adf_setup(options_i& options, vw& all)
{
  auto ld = scoped_calloc_or_throw<cb_adf>();
  bool cb_adf_option = false;
  std::string type_string = "mtr";

  option_group_definition new_options("Contextual Bandit with Action Dependent Features");
  new_options
      .add(make_option("cb_adf", cb_adf_option)
               .keep()
               .help("Do Contextual Bandit learning with multiline action dependent features."))
      .add(make_option("rank_all", ld->rank_all).keep().help("Return actions sorted by score order"))
      .add(make_option("no_predict", ld->no_predict).help("Do not do a prediction when training"))
      .add(make_option("cb_type", type_string).keep().help("contextual bandit method to use in {ips, dm, dr, mtr, sm}. Default: mtr"));
  options.add_and_parse(new_options);

  if (!cb_adf_option)
    return nullptr;

  // Ensure serialization of this option in all cases.
  if (!options.was_supplied("cb_type"))
  {
    options.insert("cb_type", type_string);
    options.add_and_parse(new_options);
  }

  ld->all = &all;

  // number of weight vectors needed
  size_t problem_multiplier = 1;  // default for IPS
  bool check_baseline_enabled = false;

  if (type_string.compare("dr") == 0)
  {
    ld->gen_cs.cb_type = CB_TYPE_DR;
    problem_multiplier = 2;
    // only use baseline when manually enabled for loss estimation
    check_baseline_enabled = true;
  }
  else if (type_string.compare("ips") == 0)
    ld->gen_cs.cb_type = CB_TYPE_IPS;
  else if (type_string.compare("mtr") == 0)
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  else if (type_string.compare("dm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_DM;
  else if (type_string.compare("sm") == 0)
    ld->gen_cs.cb_type = CB_TYPE_SM;
  else
  {
    all.trace_message << "warning: cb_type must be in {'ips','dr','mtr','dm','sm'}; resetting to mtr." << std::endl;
    ld->gen_cs.cb_type = CB_TYPE_MTR;
  }

  all.delete_prediction = ACTION_SCORE::delete_action_scores;

  // Push necessary flags.
  if ((!options.was_supplied("csoaa_ldf") && !options.was_supplied("wap_ldf")) || ld->rank_all ||
      !options.was_supplied("csoaa_rank"))
  {
    if (!options.was_supplied("csoaa_ldf"))
    {
      options.insert("csoaa_ldf", "multiline");
    }

    if (!options.was_supplied("csoaa_rank"))
    {
      options.insert("csoaa_rank", "");
    }
  }

  if (options.was_supplied("baseline") && check_baseline_enabled)
  {
    options.insert("check_enabled", "");
  }

  auto base = as_multiline(setup_base(options, all));
  all.p->lp = CB::cb_label;
  all.label_type = label_type::cb;

  cb_adf* bare = ld.get();
  learner<cb_adf, multi_ex>& l = init_learner(ld, base, CB_ADF::do_actual_learning<true>,
      CB_ADF::do_actual_learning<false>, problem_multiplier, prediction_type::action_scores);
  l.set_finish_example(CB_ADF::finish_multiline_example);

  bare->gen_cs.scorer = all.scorer;

  l.set_finish(CB_ADF::finish);
  l.set_save_load(CB_ADF::save_load);
  return make_base(l);
}